

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_quaternion.cpp
# Opt level: O0

double __thiscall ON_Quaternion::Length(ON_Quaternion *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double local_38;
  double fd;
  double fc;
  double fb;
  double fa;
  double len;
  ON_Quaternion *this_local;
  
  dVar1 = ABS(this->a);
  dVar2 = ABS(this->b);
  dVar3 = ABS(this->c);
  dVar4 = ABS(this->d);
  local_38 = dVar4;
  if (((((dVar2 < dVar1) || (dVar2 < dVar3)) || (fd = dVar3, fc = dVar1, fb = dVar2, dVar2 < dVar4))
      && (((fc = dVar2, dVar3 < dVar1 || (dVar3 < dVar2)) || (fd = dVar1, fb = dVar3, dVar3 < dVar4)
          ))) &&
     (((fd = dVar3, fb = dVar1, dVar1 <= dVar4 && (dVar2 <= dVar4)) && (dVar3 <= dVar4)))) {
    local_38 = dVar1;
    fb = dVar4;
  }
  if (fb <= 2.2250738585072014e-308) {
    if ((fb <= 0.0) || ((fb._6_2_ & 0x7ff0) == 0x7ff0)) {
      fa = 0.0;
    }
    else {
      fa = fb;
    }
  }
  else {
    dVar1 = 1.0 / fb;
    dVar1 = sqrt(dVar1 * local_38 * dVar1 * local_38 +
                 dVar1 * fd * dVar1 * fd + dVar1 * fc * dVar1 * fc + 1.0);
    fa = fb * dVar1;
  }
  return fa;
}

Assistant:

double ON_Quaternion::Length() const
{
  double len;
  double fa = fabs(a);
  double fb = fabs(b);
  double fc = fabs(c);
  double fd = fabs(d);
  if ( fb >= fa && fb >= fc && fb >= fd) 
  {
    len = fa; fa = fb; fb = len;
  }
  else if ( fc >= fa && fc >= fb && fc >= fd) 
  {
    len = fa; fa = fc; fc = len;
  }
  else if ( fd >= fa && fd >= fb && fd >= fc) 
  {
    len = fa; fa = fd; fd = len;
  }

  // 15 September 2003 Dale Lear
  //     For small denormalized doubles (positive but smaller
  //     than DBL_MIN), some compilers/FPUs set 1.0/fa to +INF.
  //     Without the ON_DBL_MIN test we end up with
  //     microscopic quaternions that have infinite norm!
  //
  //     This code is absolutely necessary.  It is a critical
  //     part of the bug fix for RR 11217.
  if ( fa > ON_DBL_MIN ) 
  {
    len = 1.0/fa;
    fb *= len;
    fc *= len;
    fd *= len;
    len = fa*sqrt(1.0 + fb*fb + fc*fc + fd*fd);
  }
  else if ( fa > 0.0 && ON_IS_FINITE(fa) )
    len = fa;
  else
    len = 0.0;

  return len;
}